

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SEES_PDU.cpp
# Opt level: O1

void __thiscall
KDIS::PDU::SEES_PDU::SetVectoringNozzleSystem
          (SEES_PDU *this,
          vector<KDIS::DATA_TYPE::VectoringNozzleSystem,_std::allocator<KDIS::DATA_TYPE::VectoringNozzleSystem>_>
          *VNS)

{
  KUINT16 *pKVar1;
  uint uVar2;
  
  pKVar1 = &(this->super_Header).super_Header6.m_ui16PDULength;
  *pKVar1 = *pKVar1 - ((ushort)((uint)(*(int *)&(this->m_vVecNozzleSys).
                                                super__Vector_base<KDIS::DATA_TYPE::VectoringNozzleSystem,_std::allocator<KDIS::DATA_TYPE::VectoringNozzleSystem>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                      *(int *)&(this->m_vVecNozzleSys).
                                               super__Vector_base<KDIS::DATA_TYPE::VectoringNozzleSystem,_std::allocator<KDIS::DATA_TYPE::VectoringNozzleSystem>_>
                                               ._M_impl.super__Vector_impl_data._M_start) >> 1) &
                      0xfff8);
  std::
  vector<KDIS::DATA_TYPE::VectoringNozzleSystem,_std::allocator<KDIS::DATA_TYPE::VectoringNozzleSystem>_>
  ::operator=(&this->m_vVecNozzleSys,VNS);
  uVar2 = (uint)(*(int *)&(this->m_vVecNozzleSys).
                          super__Vector_base<KDIS::DATA_TYPE::VectoringNozzleSystem,_std::allocator<KDIS::DATA_TYPE::VectoringNozzleSystem>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                *(int *)&(this->m_vVecNozzleSys).
                         super__Vector_base<KDIS::DATA_TYPE::VectoringNozzleSystem,_std::allocator<KDIS::DATA_TYPE::VectoringNozzleSystem>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 4;
  this->m_ui16NumVectoringNozzleSys = (KUINT16)uVar2;
  pKVar1 = &(this->super_Header).super_Header6.m_ui16PDULength;
  *pKVar1 = *pKVar1 + (short)(uVar2 << 3);
  return;
}

Assistant:

void SEES_PDU::SetVectoringNozzleSystem( const vector<VectoringNozzleSystem> & VNS )
{
    m_ui16PDULength -= VectoringNozzleSystem::VECTORING_NOZZLE_SYSTEM_SIZE * m_vVecNozzleSys.size();
    m_vVecNozzleSys = VNS;
    m_ui16NumVectoringNozzleSys = m_vVecNozzleSys.size();
    m_ui16PDULength += VectoringNozzleSystem::VECTORING_NOZZLE_SYSTEM_SIZE * m_vVecNozzleSys.size();
}